

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O2

void lscpp::protocol::from_json(json *j,DocumentDiagnosticParams *p)

{
  const_reference j_00;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"workDoneToken",&local_31);
  serializer_impl_::from_optional<std::variant<int,std::__cxx11::string>>
            (j,&local_30,
             (optional<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"partialResultToken",&local_31);
  serializer_impl_::from_optional<std::variant<int,std::__cxx11::string>>
            (j,&local_30,&(p->super_PartialResultParams).partialResultToken);
  std::__cxx11::string::~string((string *)&local_30);
  j_00 = nlohmann::json_abi_v3_11_2::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         ::at<const_char_(&)[13],_0>(j,(char (*) [13])"textDocument");
  from_json(j_00,&p->textDocument);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"identifier",&local_31);
  serializer_impl_::from_optional<std::__cxx11::string>(j,&local_30,&p->identifier);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"previousResultId",&local_31);
  serializer_impl_::from_optional<std::__cxx11::string>(j,&local_30,&p->previousResultId);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void from_json(const nlohmann::json &j, protocol::DocumentDiagnosticParams &p) {
  FROM_OPTIONAL(workDoneToken);
  FROM_OPTIONAL(partialResultToken);
  j.at("textDocument").get_to(p.textDocument);
  FROM_OPTIONAL(identifier);
  FROM_OPTIONAL(previousResultId);
}